

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QUrl __thiscall QFileDialog::directoryUrl(QFileDialog *this)

{
  QPlatformDialogHelper *pQVar1;
  long in_RSI;
  long in_FS_OFFSET;
  undefined1 local_40 [32];
  QWidgetData *local_20;
  
  local_20 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if ((*(QDialogPrivate **)(in_RSI + 8))->nativeDialogInUse == true) {
    pQVar1 = QDialogPrivate::platformHelper(*(QDialogPrivate **)(in_RSI + 8));
    if (pQVar1 == (QPlatformDialogHelper *)0x0) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_20) goto LAB_004e24fb;
      QUrl::QUrl((QUrl *)this);
    }
    else {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_20) {
LAB_004e24fb:
        __stack_chk_fail();
      }
      (**(code **)(*(long *)pQVar1 + 0x90))(this,pQVar1);
    }
  }
  else {
    directory((QFileDialog *)local_40);
    QDir::absolutePath();
    QUrl::fromLocalFile((QString *)this);
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    QDir::~QDir((QDir *)local_40);
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_20) goto LAB_004e24fb;
  }
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QFileDialog::directoryUrl() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse)
        return d->directory_sys();
    else
        return QUrl::fromLocalFile(directory().absolutePath());
}